

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

Buffer * __thiscall sznet::net::Buffer::retrieveAsString_abi_cxx11_(Buffer *this,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  ulong in_RDX;
  allocator local_22;
  undefined1 local_21;
  ulong local_20;
  size_t len_local;
  Buffer *this_local;
  string *result;
  
  local_20 = in_RDX;
  len_local = len;
  this_local = this;
  sVar2 = readableBytes((Buffer *)len);
  if (sVar2 < in_RDX) {
    __assert_fail("len <= readableBytes()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0xa5,"string sznet::net::Buffer::retrieveAsString(size_t)");
  }
  local_21 = 0;
  pcVar3 = peek((Buffer *)len);
  uVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar3,uVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  retrieve((Buffer *)len,local_20);
  return this;
}

Assistant:

string retrieveAsString(size_t len)
	{
		assert(len <= readableBytes());
		string result(peek(), len);
		retrieve(len);
		return result;
	}